

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall
ON_NurbsSurface::TensorProduct
          (ON_NurbsSurface *this,ON_NurbsCurve *nurbscurveA,ON_NurbsCurve *nurbscurveB,
          ON_TensorProduct *tensor)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int cv_count0;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  char *sFormat;
  double dVar14;
  double dVar15;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  iVar3 = (*(nurbscurveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                    (nurbscurveA);
  iVar4 = (*(nurbscurveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                    (nurbscurveB);
  iVar5 = (*tensor->_vptr_ON_TensorProduct[4])(tensor);
  iVar6 = (*tensor->_vptr_ON_TensorProduct[2])(tensor);
  if (iVar3 < iVar6) {
    sFormat = "ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA";
    iVar5 = 0xaeb;
  }
  else {
    iVar6 = (*tensor->_vptr_ON_TensorProduct[3])(tensor);
    if (iVar6 <= iVar4) {
      bVar1 = ON_NurbsCurve::IsRational(nurbscurveA);
      bVar2 = ON_NurbsCurve::IsRational(nurbscurveB);
      cv_count0 = ON_NurbsCurve::CVCount(nurbscurveA);
      iVar6 = ON_NurbsCurve::CVCount(nurbscurveB);
      iVar7 = ON_NurbsCurve::Order(nurbscurveA);
      iVar8 = ON_NurbsCurve::Order(nurbscurveB);
      Create(this,iVar5,bVar1 || bVar2,iVar7,iVar8,cv_count0,iVar6);
      pdVar10 = this->m_knot[0];
      pdVar11 = nurbscurveA->m_knot;
      if (pdVar10 != pdVar11) {
        iVar7 = KnotCount(this,0);
        memcpy(pdVar10,pdVar11,(long)iVar7 << 3);
      }
      pdVar10 = this->m_knot[1];
      pdVar11 = nurbscurveB->m_knot;
      if (pdVar10 != pdVar11) {
        iVar7 = KnotCount(this,1);
        memcpy(pdVar10,pdVar11,(long)iVar7 << 3);
      }
      iVar7 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (cv_count0 < 1) {
        cv_count0 = iVar7;
      }
      do {
        if (iVar7 == cv_count0) {
          return true;
        }
        pdVar10 = ON_NurbsCurve::CV(nurbscurveA,iVar7);
        for (iVar8 = 0; iVar8 != iVar6; iVar8 = iVar8 + 1) {
          pdVar11 = ON_NurbsCurve::CV(nurbscurveB,iVar8);
          pdVar12 = CV(this,iVar7,iVar8);
          dVar14 = 1.0;
          if (bVar1) {
            dVar14 = pdVar10[iVar3];
          }
          dVar15 = 1.0;
          if (bVar2) {
            dVar15 = pdVar11[iVar4];
          }
          iVar9 = (*tensor->_vptr_ON_TensorProduct[5])
                            (~-(ulong)(dVar14 == 0.0) & (ulong)(1.0 / dVar14),
                             ~-(ulong)(dVar15 == 0.0) & (ulong)(1.0 / dVar15),tensor,pdVar10,pdVar11
                             ,pdVar12);
          if ((char)iVar9 == '\0') {
            return false;
          }
          if (bVar1 || bVar2) {
            for (lVar13 = 0; iVar5 != (int)lVar13; lVar13 = lVar13 + 1) {
              pdVar12[lVar13] = pdVar12[lVar13] * dVar14 * dVar15;
            }
            pdVar12[lVar13] = dVar14 * dVar15;
          }
        }
        iVar7 = iVar7 + 1;
      } while( true );
    }
    sFormat = "ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB";
    iVar5 = 0xaef;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_nurbssurface.cpp"
             ,iVar5,"",sFormat);
  return false;
}

Assistant:

bool ON_NurbsSurface::TensorProduct(
      const ON_NurbsCurve& nurbscurveA,
      const ON_NurbsCurve& nurbscurveB,
      ON_TensorProduct& tensor
      )
{
  DestroySurfaceTree();
  //   The resulting surface will satisfy
  // 	 NurbSrf(s,t) = T( NurbA(s), NurbB(t) )
  // 
  //   If you want to understand the relationship between multilinear maps
  //   and tensor products, read chapter 16 of Serge Lang's Algebra book.
  //   The connection between Lang and tensor product nurb surfaces being
  //   that NurbA and NurbB are elements of the module of piecewise polynomial
  //   functions that satisfy certain degree and continuity constraints.

  bool rc;
	double wA, wB, wC;
	const double *cvA, *cvB;
	double *cvC;
	int i, j, k,  cv_countA, cv_countB, dimA, dimB, dimC, is_ratA, is_ratB, is_ratC;

	dimA = nurbscurveA.Dimension();
	dimB = nurbscurveB.Dimension();
	dimC = tensor.DimensionC();

  if ( tensor.DimensionA() > dimA ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionA() > dimA");
    return false;
  }
  if ( tensor.DimensionB() > dimB ) {
    ON_ERROR("ON_NurbsSurface::TensorProduct() - tensor.DimensionB() > dimB");
    return false;
  }

	is_ratA = nurbscurveA.IsRational();
	is_ratB = nurbscurveB.IsRational();
	is_ratC = (is_ratA || is_ratB);
  cv_countA = nurbscurveA.CVCount();
  cv_countB = nurbscurveB.CVCount();

  Create( dimC, is_ratC, nurbscurveA.Order(), nurbscurveB.Order(), cv_countA, cv_countB );

  if ( m_knot[0] != nurbscurveA.m_knot )
    memcpy( m_knot[0], nurbscurveA.m_knot, KnotCount(0)*sizeof(*m_knot[0]) );
  if ( m_knot[1] != nurbscurveB.m_knot )
    memcpy( m_knot[1], nurbscurveB.m_knot, KnotCount(1)*sizeof(*m_knot[1]) );

	for (i = 0; i < cv_countA; i++) {
    cvA = nurbscurveA.CV(i);
		for (j = 0; j < cv_countB; j++) {
  		cvB = nurbscurveB.CV(j);
      cvC = CV(i,j);
			wA = (is_ratA) ? cvA[dimA] : 1.0;
			wB = (is_ratB) ? cvB[dimB] : 1.0;
			rc = tensor.Evaluate( (wA == 0.0) ? 0.0 : 1.0/wA, cvA, 
									          (wB == 0.0) ? 0.0 : 1.0/wB, cvB, 
									          cvC );
      if ( !rc )
        return false;
			if (is_ratC) {
  			wC = wA*wB;
        for ( k = 0; k < dimC; k++ )
          *cvC++ *= wC;
        *cvC = wC;
			}
		}
	}
	return true;
}